

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O3

Id __thiscall
dxil_spv::SPIRVModule::Impl::build_allocate_node_records
          (Impl *this,SPIRVModule *param_1,bool per_thread)

{
  Vector<std::unique_ptr<Instruction>_> *pVVar1;
  Vector<Id> *pVVar2;
  Set<spv::Capability> *this_00;
  pointer *this_01;
  _Head_base<0UL,_spv::Instruction_*,_false> _Var3;
  Impl *pIVar4;
  Block *elseBlock;
  Id IVar5;
  Id IVar6;
  Capability CVar7;
  Function *pFVar8;
  Instruction *pIVar9;
  Block *pBVar10;
  undefined8 *puVar11;
  Block *mergeBlock;
  Instruction *pIVar12;
  Instruction *pIVar13;
  uint *puVar14;
  Instruction *pIVar15;
  char *name;
  pointer ppBVar16;
  undefined7 in_register_00000011;
  iterator iVar17;
  Builder *pBVar18;
  Block *entry;
  Vector<Id> local_268;
  vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *local_248;
  Block *local_240;
  Impl *local_238;
  Function *local_230;
  Block *local_228;
  Instruction *local_220;
  Builder *local_218;
  Instruction *local_210;
  Capability local_208;
  undefined4 local_204;
  Capability local_200;
  Capability local_1fc;
  Block *local_1f8;
  Instruction *local_1f0;
  Instruction *local_1e8;
  Instruction *local_1e0;
  Instruction *local_1d8;
  Instruction *local_1d0;
  Instruction *local_1c8;
  Vector<std::unique_ptr<Instruction>_> *local_1c0;
  Vector<std::unique_ptr<Instruction>_> *local_1b8;
  Instruction *local_1b0;
  Instruction *local_1a8;
  Instruction *local_1a0;
  Instruction *local_198;
  Instruction *local_190;
  Instruction *local_188;
  Instruction *local_180;
  Instruction *local_178;
  Instruction *local_170;
  ulong local_168;
  Block *local_160;
  _Head_base<0UL,_spv::Instruction_*,_false> local_158;
  _Head_base<0UL,_spv::Instruction_*,_false> local_150;
  _Head_base<0UL,_spv::Instruction_*,_false> local_148;
  _Head_base<0UL,_spv::Instruction_*,_false> local_140;
  _Head_base<0UL,_spv::Instruction_*,_false> local_138;
  _Head_base<0UL,_spv::Instruction_*,_false> local_130;
  _Head_base<0UL,_spv::Instruction_*,_false> local_128;
  _Head_base<0UL,_spv::Instruction_*,_false> local_120;
  _Head_base<0UL,_spv::Instruction_*,_false> local_118;
  _Head_base<0UL,_spv::Instruction_*,_false> local_110;
  _Head_base<0UL,_spv::Instruction_*,_false> local_108;
  _Head_base<0UL,_spv::Instruction_*,_false> local_100;
  _Head_base<0UL,_spv::Instruction_*,_false> local_f8;
  _Head_base<0UL,_spv::Instruction_*,_false> local_f0;
  _Head_base<0UL,_spv::Instruction_*,_false> local_e8;
  _Head_base<0UL,_spv::Instruction_*,_false> local_e0;
  _Head_base<0UL,_spv::Instruction_*,_false> local_d8;
  _Head_base<0UL,_spv::Instruction_*,_false> local_d0;
  _Head_base<0UL,_spv::Instruction_*,_false> local_c8;
  _Head_base<0UL,_spv::Instruction_*,_false> local_c0;
  _Head_base<0UL,_spv::Instruction_*,_false> local_b8;
  _Head_base<0UL,_spv::Instruction_*,_false> local_b0;
  _Head_base<0UL,_spv::Instruction_*,_false> local_a8;
  _Head_base<0UL,_spv::Instruction_*,_false> local_a0;
  _Head_base<0UL,_spv::Instruction_*,_false> local_98;
  _Head_base<0UL,_spv::Instruction_*,_false> local_90;
  _Head_base<0UL,_spv::Instruction_*,_false> local_88;
  _Head_base<0UL,_spv::Instruction_*,_false> local_80;
  _Head_base<0UL,_spv::Instruction_*,_false> local_78;
  _Head_base<0UL,_spv::Instruction_*,_false> local_70;
  _Head_base<0UL,_spv::Instruction_*,_false> local_68;
  _Head_base<0UL,_spv::Instruction_*,_false> local_60;
  _Head_base<0UL,_spv::Instruction_*,_false> local_58;
  _Head_base<0UL,_spv::Instruction_*,_false> local_50;
  undefined1 local_48 [16];
  pointer local_38;
  
  local_168 = (ulong)!per_thread;
  if ((&this->allocate_thread_node_records_call_id)[local_168] == 0) {
    pBVar18 = &this->builder;
    local_160 = (this->builder).buildPoint;
    local_1f8 = (Block *)0x0;
    IVar5 = spv::Builder::makeBoolType(pBVar18);
    local_238 = (Impl *)CONCAT44(local_238._4_4_,IVar5);
    IVar5 = spv::Builder::makeIntegerType(pBVar18,0x20,false);
    IVar6 = spv::Builder::makeIntegerType(pBVar18,0x40,false);
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)allocate_in_thread(0x14);
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_start + 5;
    *local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
     _M_impl.super__Vector_impl_data._M_start = IVar6;
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start[1] = IVar5;
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start[2] = IVar5;
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start[3] = IVar5;
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start[4] = IVar5;
    name = "AllocateGroupNodeRecords";
    if (per_thread) {
      name = "AllocateThreadNodeRecords";
    }
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_38 = (pointer)0x0;
    local_48 = (undefined1  [16])0x0;
    local_248 = (vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                CONCAT44(local_248._4_4_,IVar5);
    local_204 = (int)CONCAT71(in_register_00000011,per_thread);
    pFVar8 = spv::Builder::makeFunctionEntry
                       (pBVar18,DecorationMax,IVar5,name,&local_268,
                        (vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                         *)local_48,&local_1f8);
    std::
    vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ::~vector((vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
               *)local_48);
    if ((__uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>)
        local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (__uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>)0x0) {
      free_in_thread(local_268.
                     super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_start);
    }
    spv::Builder::addName
              (pBVar18,(*(pFVar8->parameterInstructions).
                         super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                         ._M_impl.super__Vector_impl_data._M_start)->resultId,"AtomicCountersBDA");
    spv::Builder::addName
              (pBVar18,(pFVar8->parameterInstructions).
                       super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[1]->resultId,"NodeMetadataIndex");
    spv::Builder::addName
              (pBVar18,(pFVar8->parameterInstructions).
                       super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[2]->resultId,"Count");
    spv::Builder::addName
              (pBVar18,(pFVar8->parameterInstructions).
                       super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[3]->resultId,"Stride");
    spv::Builder::addName
              (pBVar18,(pFVar8->parameterInstructions).
                       super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[4]->resultId,"AllocationOffset");
    local_230 = pFVar8;
    local_218 = pBVar18;
    if ((char)local_204 == '\0') {
      local_210 = (Instruction *)
                  CONCAT44(local_210._4_4_,
                           (pFVar8->parameterInstructions).
                           super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[2]->resultId);
      local_200 = CapabilityMatrix;
    }
    else {
      local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = CapabilityGroupNonUniformBallot;
      this_00 = &(this->builder).capabilities;
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                  *)this_00,(Capability *)&local_268);
      local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = CapabilityGroupNonUniformArithmetic;
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                  *)this_00,(Capability *)&local_268);
      IVar5 = (this->builder).uniqueId + 1;
      (this->builder).uniqueId = IVar5;
      pIVar9 = (Instruction *)allocate_in_thread(0x38);
      pIVar9->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
      pIVar9->resultId = IVar5;
      pIVar9->typeId = (Id)local_248;
      pIVar9->opCode = OpGroupNonUniformIAdd;
      pVVar2 = &pIVar9->operands;
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      *(undefined1 (*) [16])
       &(pIVar9->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
      IVar5 = spv::Builder::makeIntegerType(pBVar18,0x20,false);
      local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ =
           spv::Builder::makeIntConstant(pBVar18,IVar5,3,false);
      iVar17._M_current =
           (pIVar9->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      puVar14 = (pIVar9->operands).
                super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
      if (iVar17._M_current == puVar14) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,
                   iVar17,(uint *)&local_268);
        iVar17._M_current =
             (pIVar9->operands).
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_finish;
        puVar14 = (pIVar9->operands).
                  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
      }
      else {
        *iVar17._M_current =
             (Capability)
             local_268.
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
        iVar17._M_current = iVar17._M_current + 1;
        (pIVar9->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar17._M_current;
      }
      pBVar18 = local_218;
      pFVar8 = local_230;
      local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = CapabilityMatrix;
      if (iVar17._M_current == puVar14) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,
                   iVar17,(uint *)&local_268);
        iVar17._M_current =
             (pIVar9->operands).
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_finish;
        puVar14 = (pIVar9->operands).
                  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
      }
      else {
        *iVar17._M_current = 0;
        iVar17._M_current = iVar17._M_current + 1;
        (pIVar9->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar17._M_current;
      }
      local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ =
           (pFVar8->parameterInstructions).
           super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
           ._M_impl.super__Vector_impl_data._M_start[2]->resultId;
      if (iVar17._M_current == puVar14) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,
                   iVar17,(uint *)&local_268);
      }
      else {
        *iVar17._M_current =
             (Capability)
             local_268.
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
        (pIVar9->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar17._M_current + 1;
      }
      local_210 = (Instruction *)CONCAT44(local_210._4_4_,pIVar9->resultId);
      local_98._M_head_impl = pIVar9;
      add_instruction(this,local_1f8,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_98);
      if (local_98._M_head_impl != (Instruction *)0x0) {
        (*(local_98._M_head_impl)->_vptr_Instruction[1])();
      }
      local_98._M_head_impl = (Instruction *)0x0;
      local_200 = spv::Builder::createUndefined(pBVar18,(Id)local_248);
    }
    pBVar10 = (Block *)allocate_in_thread(0x78);
    IVar5 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar5;
    pBVar10->_vptr_Block = (_func_int **)&PTR__Block_001f3cc8;
    (pBVar10->instructions).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pBVar10->instructions).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined1 (*) [16])
     &(pBVar10->instructions).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
    (pBVar10->predecessors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pBVar10->predecessors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pBVar10->successors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pBVar10->successors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined1 (*) [16])
     &(pBVar10->successors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
    (pBVar10->localVariables).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pBVar10->localVariables).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pBVar10->parent = pFVar8;
    pBVar10->unreachable = false;
    puVar11 = (undefined8 *)allocate_in_thread(0x38);
    *puVar11 = &PTR__Instruction_001f31e0;
    *(Id *)(puVar11 + 1) = IVar5;
    *(undefined8 *)((long)puVar11 + 0xc) = 0xf800000000;
    *(undefined1 (*) [16])(puVar11 + 3) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(puVar11 + 5) = (undefined1  [16])0x0;
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)puVar11;
    std::
    vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)&pBVar10->instructions,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_268);
    if ((__uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>)
        local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (__uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>)0x0) {
      (**(code **)(*(long *)local_268.
                            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start + 8))();
    }
    ((pBVar10->instructions).
     super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
     ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
     super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
     super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
     super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl)->block = pBVar10;
    spv::Module::mapInstruction
              (local_230->parent,
               (pBVar10->instructions).
               super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
               super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
    IVar5 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar5;
    pIVar9 = (Instruction *)allocate_in_thread(0x38);
    pIVar9->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
    pIVar9->resultId = IVar5;
    pIVar9->typeId = (Id)local_238;
    pIVar9->opCode = OpIEqual;
    (pIVar9->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pIVar9->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined1 (*) [16])
     &(pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = (Capability)local_210;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar9->operands,(iterator)0x0,(uint *)&local_268);
    pBVar18 = local_218;
    IVar5 = spv::Builder::makeIntegerType(local_218,0x20,false);
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ =
         spv::Builder::makeIntConstant(pBVar18,IVar5,0,false);
    iVar17._M_current =
         (pIVar9->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar17._M_current ==
        (pIVar9->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar9->operands,iVar17,(uint *)&local_268);
    }
    else {
      *iVar17._M_current =
           (Capability)
           local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar17._M_current + 1;
    }
    local_240 = (Block *)CONCAT44(local_240._4_4_,pIVar9->resultId);
    local_a0._M_head_impl = pIVar9;
    add_instruction(this,local_1f8,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_a0);
    pFVar8 = local_230;
    if (local_a0._M_head_impl != (Instruction *)0x0) {
      (*(local_a0._M_head_impl)->_vptr_Instruction[1])();
    }
    local_a0._M_head_impl = (Instruction *)0x0;
    mergeBlock = (Block *)allocate_in_thread(0x78);
    IVar5 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar5;
    mergeBlock->_vptr_Block = (_func_int **)&PTR__Block_001f3cc8;
    (mergeBlock->instructions).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (mergeBlock->instructions).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined1 (*) [16])
     &(mergeBlock->instructions).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
    (mergeBlock->predecessors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (mergeBlock->predecessors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (mergeBlock->successors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (mergeBlock->successors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined1 (*) [16])
     &(mergeBlock->successors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
    (mergeBlock->localVariables).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (mergeBlock->localVariables).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    mergeBlock->parent = pFVar8;
    mergeBlock->unreachable = false;
    puVar11 = (undefined8 *)allocate_in_thread(0x38);
    *puVar11 = &PTR__Instruction_001f31e0;
    *(Id *)(puVar11 + 1) = IVar5;
    *(undefined8 *)((long)puVar11 + 0xc) = 0xf800000000;
    *(undefined1 (*) [16])(puVar11 + 3) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(puVar11 + 5) = (undefined1  [16])0x0;
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)puVar11;
    local_1b8 = &mergeBlock->instructions;
    std::
    vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)&mergeBlock->instructions,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_268);
    if ((__uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>)
        local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (__uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>)0x0) {
      (**(code **)(*(long *)local_268.
                            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start + 8))();
    }
    ((mergeBlock->instructions).
     super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
     ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
     super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
     super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
     super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl)->block = mergeBlock;
    spv::Module::mapInstruction
              (pFVar8->parent,
               (mergeBlock->instructions).
               super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
               super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
    pBVar18 = local_218;
    (this->builder).buildPoint = local_1f8;
    spv::Builder::createSelectionMerge(local_218,mergeBlock,0);
    spv::Builder::createConditionalBranch(pBVar18,(Id)local_240,pBVar10,mergeBlock);
    (this->builder).buildPoint = pBVar10;
    IVar5 = spv::Builder::makeIntegerType(pBVar18,0x20,false);
    IVar5 = spv::Builder::makeIntConstant(pBVar18,IVar5,0,false);
    spv::Builder::makeReturn(pBVar18,false,IVar5);
    local_240 = (Block *)allocate_in_thread(0x78);
    IVar5 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar5;
    local_240->_vptr_Block = (_func_int **)&PTR__Block_001f3cc8;
    pVVar1 = &local_240->instructions;
    (local_240->instructions).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_240->instructions).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined1 (*) [16])
     &(local_240->instructions).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
    (local_240->predecessors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_240->predecessors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_240->successors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_240->successors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined1 (*) [16])
     &(local_240->successors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
    (local_240->localVariables).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_240->localVariables).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_240->parent = pFVar8;
    local_240->unreachable = false;
    puVar11 = (undefined8 *)allocate_in_thread(0x38);
    *puVar11 = &PTR__Instruction_001f31e0;
    *(Id *)(puVar11 + 1) = IVar5;
    *(undefined8 *)((long)puVar11 + 0xc) = 0xf800000000;
    *(undefined1 (*) [16])(puVar11 + 3) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(puVar11 + 5) = (undefined1  [16])0x0;
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)puVar11;
    local_1c0 = pVVar1;
    std::
    vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)pVVar1,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_268);
    if ((__uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>)
        local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (__uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>)0x0) {
      (**(code **)(*(long *)local_268.
                            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start + 8))();
    }
    ((local_240->instructions).
     super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
     ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
     super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
     super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
     super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl)->block = local_240;
    spv::Module::mapInstruction
              (pFVar8->parent,
               (local_240->instructions).
               super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
               super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
    local_228 = (Block *)allocate_in_thread(0x78);
    IVar5 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar5;
    local_228->_vptr_Block = (_func_int **)&PTR__Block_001f3cc8;
    pVVar1 = &local_228->instructions;
    (local_228->instructions).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_228->instructions).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined1 (*) [16])
     &(local_228->instructions).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
    (local_228->predecessors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_228->predecessors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_228->successors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_228->successors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined1 (*) [16])
     &(local_228->successors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
    (local_228->localVariables).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_228->localVariables).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_228->parent = pFVar8;
    local_228->unreachable = false;
    puVar11 = (undefined8 *)allocate_in_thread(0x38);
    *puVar11 = &PTR__Instruction_001f31e0;
    *(Id *)(puVar11 + 1) = IVar5;
    *(undefined8 *)((long)puVar11 + 0xc) = 0xf800000000;
    *(undefined1 (*) [16])(puVar11 + 3) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(puVar11 + 5) = (undefined1  [16])0x0;
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)puVar11;
    std::
    vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)pVVar1,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_268);
    if ((__uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>)
        local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (__uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>)0x0) {
      (**(code **)(*(long *)local_268.
                            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start + 8))();
    }
    ((local_228->instructions).
     super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
     ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
     super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
     super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
     super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl)->block = local_228;
    spv::Module::mapInstruction
              (pFVar8->parent,
               (local_228->instructions).
               super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
               super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
    if ((char)local_204 == '\0') {
      IVar5 = (Id)local_248;
      local_208 = spv::Builder::createVariable
                            (pBVar18,StorageClassWorkgroup,(Id)local_248,
                             "AllocateGroupNodeRecordsShared");
      register_active_variable(this,StorageClassWorkgroup,local_208);
      IVar6 = get_builtin_shader_input(this,BuiltInLocalInvocationIndex);
      local_220 = (Instruction *)CONCAT44(local_220._4_4_,IVar6);
      IVar6 = (this->builder).uniqueId + 1;
      (this->builder).uniqueId = IVar6;
      pIVar9 = (Instruction *)allocate_in_thread(0x38);
      pIVar9->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
      pIVar9->resultId = IVar6;
      pIVar9->typeId = IVar5;
      pIVar9->opCode = OpLoad;
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      *(undefined1 (*) [16])
       &(pIVar9->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
      local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = (Capability)local_220;
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar9->operands,(iterator)0x0,(uint *)&local_268);
      IVar5 = (this->builder).uniqueId + 1;
      (this->builder).uniqueId = IVar5;
      pIVar12 = (Instruction *)allocate_in_thread(0x38);
      pIVar12->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
      pIVar12->resultId = IVar5;
      pIVar12->typeId = (Id)local_238;
      pIVar12->opCode = OpIEqual;
      (pIVar12->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pIVar12->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      *(undefined1 (*) [16])
       &(pIVar12->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
      local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = pIVar9->resultId;
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar12->operands,(iterator)0x0,(uint *)&local_268);
      IVar5 = spv::Builder::makeIntegerType(pBVar18,0x20,false);
      local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ =
           spv::Builder::makeIntConstant(pBVar18,IVar5,0,false);
      iVar17._M_current =
           (pIVar12->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar17._M_current ==
          (pIVar12->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                   &pIVar12->operands,iVar17,(uint *)&local_268);
      }
      else {
        *iVar17._M_current =
             (Capability)
             local_268.
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
        (pIVar12->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar17._M_current + 1;
      }
      IVar5 = pIVar12->resultId;
      local_b0._M_head_impl = pIVar9;
      add_instruction(this,mergeBlock,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_b0);
      if (local_b0._M_head_impl != (Instruction *)0x0) {
        (*(local_b0._M_head_impl)->_vptr_Instruction[1])();
      }
      local_b0._M_head_impl = (Instruction *)0x0;
      local_b8._M_head_impl = pIVar12;
      add_instruction(this,mergeBlock,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_b8);
      if (local_b8._M_head_impl != (Instruction *)0x0) {
        (*(local_b8._M_head_impl)->_vptr_Instruction[1])();
      }
      local_b8._M_head_impl = (Instruction *)0x0;
      pBVar18 = local_218;
    }
    else {
      IVar5 = (this->builder).uniqueId + 1;
      (this->builder).uniqueId = IVar5;
      pIVar9 = (Instruction *)allocate_in_thread(0x38);
      pIVar9->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
      pIVar9->resultId = IVar5;
      pIVar9->typeId = (Id)local_238;
      pIVar9->opCode = OpGroupNonUniformElect;
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      *(undefined1 (*) [16])
       &(pIVar9->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
      IVar5 = spv::Builder::makeIntegerType(pBVar18,0x20,false);
      IVar5 = spv::Builder::makeIntConstant(pBVar18,IVar5,3,false);
      local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = IVar5;
      iVar17._M_current =
           (pIVar9->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar17._M_current ==
          (pIVar9->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                   &pIVar9->operands,iVar17,(uint *)&local_268);
      }
      else {
        *iVar17._M_current = IVar5;
        (pIVar9->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar17._M_current + 1;
      }
      IVar5 = pIVar9->resultId;
      local_a8._M_head_impl = pIVar9;
      add_instruction(this,mergeBlock,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_a8);
      if (local_a8._M_head_impl != (Instruction *)0x0) {
        (*(local_a8._M_head_impl)->_vptr_Instruction[1])();
      }
      local_a8._M_head_impl = (Instruction *)0x0;
      local_208 = CapabilityMatrix;
    }
    elseBlock = local_228;
    (this->builder).buildPoint = mergeBlock;
    spv::Builder::createSelectionMerge(pBVar18,local_228,0);
    pBVar10 = local_240;
    spv::Builder::createConditionalBranch(pBVar18,IVar5,local_240,elseBlock);
    (this->builder).buildPoint = pBVar10;
    IVar5 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar5;
    pIVar9 = (Instruction *)allocate_in_thread(0x38);
    pIVar9->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
    pIVar9->resultId = IVar5;
    pIVar9->typeId = (Id)local_248;
    pIVar9->opCode = OpIMul;
    (pIVar9->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pIVar9->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined1 (*) [16])
     &(pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = (Capability)local_210;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar9->operands,(iterator)0x0,(uint *)&local_268);
    iVar17._M_current =
         (pIVar9->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ =
         (local_230->parameterInstructions).
         super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
         ._M_impl.super__Vector_impl_data._M_start[3]->resultId;
    if (iVar17._M_current ==
        (pIVar9->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar9->operands,iVar17,(uint *)&local_268);
    }
    else {
      *iVar17._M_current =
           (Capability)
           local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar17._M_current + 1;
    }
    IVar5 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar5;
    local_238 = this;
    pIVar12 = (Instruction *)allocate_in_thread(0x38);
    pIVar12->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
    pIVar12->resultId = IVar5;
    pIVar12->typeId = (Id)local_248;
    pIVar12->opCode = OpIAdd;
    (pIVar12->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pIVar12->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined1 (*) [16])
     &(pIVar12->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = pIVar9->resultId;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar12->operands,(iterator)0x0,(uint *)&local_268);
    IVar5 = spv::Builder::makeIntegerType(pBVar18,0x20,false);
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ =
         spv::Builder::makeIntConstant(pBVar18,IVar5,0xf,false);
    iVar17._M_current =
         (pIVar12->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar17._M_current ==
        (pIVar12->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar12->operands,iVar17,(uint *)&local_268);
    }
    else {
      *iVar17._M_current =
           (Capability)
           local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (pIVar12->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar17._M_current + 1;
    }
    IVar5 = (local_238->builder).uniqueId + 1;
    (local_238->builder).uniqueId = IVar5;
    pIVar13 = (Instruction *)allocate_in_thread(0x38);
    pIVar13->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
    pIVar13->resultId = IVar5;
    pIVar13->typeId = (Id)local_248;
    pIVar13->opCode = OpBitwiseAnd;
    (pIVar13->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pIVar13->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined1 (*) [16])
     &(pIVar13->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = pIVar12->resultId;
    local_178 = pIVar12;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar13->operands,(iterator)0x0,(uint *)&local_268);
    IVar5 = spv::Builder::makeIntegerType(pBVar18,0x20,false);
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ =
         spv::Builder::makeIntConstant(pBVar18,IVar5,0xfffffff0,false);
    iVar17._M_current =
         (pIVar13->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar17._M_current ==
        (pIVar13->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar13->operands,iVar17,(uint *)&local_268);
    }
    else {
      *iVar17._M_current =
           (Capability)
           local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (pIVar13->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar17._M_current + 1;
    }
    IVar5 = (Id)local_248;
    local_1c8 = pIVar13;
    local_170 = pIVar9;
    IVar6 = spv::Builder::makeRuntimeArray(pBVar18,(Id)local_248);
    spv::Builder::addDecoration(pBVar18,IVar6,DecorationArrayStride,4);
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)allocate_in_thread(0xc);
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_start + 3;
    *local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
     _M_impl.super__Vector_impl_data._M_start = IVar5;
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start[1] = IVar5;
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start[2] = IVar6;
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    IVar5 = spv::Builder::makeStructType(pBVar18,&local_268,"NodeAtomics");
    if ((__uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>)
        local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (__uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>)0x0) {
      free_in_thread(local_268.
                     super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_start);
    }
    spv::Builder::addDecoration(pBVar18,IVar5,DecorationBlock,-1);
    spv::Builder::addMemberName(pBVar18,IVar5,0,"payloadCount");
    spv::Builder::addMemberName(pBVar18,IVar5,1,"fusedCount");
    spv::Builder::addMemberName(pBVar18,IVar5,2,"perNodeTotal");
    spv::Builder::addMemberDecoration(pBVar18,IVar5,0,DecorationOffset,0);
    spv::Builder::addMemberDecoration(pBVar18,IVar5,1,DecorationOffset,4);
    spv::Builder::addMemberDecoration(pBVar18,IVar5,2,DecorationOffset,8);
    pIVar4 = local_238;
    IVar6 = (local_238->builder).uniqueId + 1;
    (local_238->builder).uniqueId = IVar6;
    IVar5 = spv::Builder::makePointer(pBVar18,StorageClassPhysicalStorageBuffer,IVar5);
    pIVar9 = (Instruction *)allocate_in_thread(0x38);
    pIVar9->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
    pIVar9->resultId = IVar6;
    pIVar9->typeId = IVar5;
    pIVar9->opCode = OpBitcast;
    (pIVar9->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pIVar9->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined1 (*) [16])
     &(pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ =
         (*(local_230->parameterInstructions).
           super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
           ._M_impl.super__Vector_impl_data._M_start)->resultId;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar9->operands,(iterator)0x0,(uint *)&local_268);
    IVar6 = (pIVar4->builder).uniqueId + 1;
    (pIVar4->builder).uniqueId = IVar6;
    IVar5 = spv::Builder::makePointer(pBVar18,StorageClassPhysicalStorageBuffer,(Id)local_248);
    pIVar12 = (Instruction *)allocate_in_thread(0x38);
    pIVar12->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
    pIVar12->resultId = IVar6;
    pIVar12->typeId = IVar5;
    pIVar12->opCode = OpInBoundsAccessChain;
    (pIVar12->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pIVar12->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined1 (*) [16])
     &(pIVar12->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = pIVar9->resultId;
    local_220 = pIVar9;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar12->operands,(iterator)0x0,(uint *)&local_268);
    IVar5 = spv::Builder::makeIntegerType(pBVar18,0x20,false);
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ =
         spv::Builder::makeIntConstant(pBVar18,IVar5,0,false);
    iVar17._M_current =
         (pIVar12->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar17._M_current ==
        (pIVar12->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar12->operands,iVar17,(uint *)&local_268);
    }
    else {
      *iVar17._M_current =
           (Capability)
           local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (pIVar12->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar17._M_current + 1;
    }
    IVar6 = (local_238->builder).uniqueId + 1;
    (local_238->builder).uniqueId = IVar6;
    IVar5 = spv::Builder::makePointer(pBVar18,StorageClassPhysicalStorageBuffer,(Id)local_248);
    pIVar13 = (Instruction *)allocate_in_thread(0x38);
    pIVar13->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
    pIVar13->resultId = IVar6;
    pIVar13->typeId = IVar5;
    pIVar13->opCode = OpInBoundsAccessChain;
    (pIVar13->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pIVar13->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined1 (*) [16])
     &(pIVar13->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = local_220->resultId;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar13->operands,(iterator)0x0,(uint *)&local_268);
    IVar5 = spv::Builder::makeIntegerType(pBVar18,0x20,false);
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ =
         spv::Builder::makeIntConstant(pBVar18,IVar5,1,false);
    pIVar9 = local_1c8;
    iVar17._M_current =
         (pIVar13->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_1d0 = pIVar13;
    if (iVar17._M_current ==
        (pIVar13->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar13->operands,iVar17,(uint *)&local_268);
    }
    else {
      *iVar17._M_current =
           (Capability)
           local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (pIVar13->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar17._M_current + 1;
    }
    IVar5 = (local_238->builder).uniqueId + 1;
    (local_238->builder).uniqueId = IVar5;
    pIVar13 = (Instruction *)allocate_in_thread(0x38);
    pIVar13->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
    pIVar13->resultId = IVar5;
    pIVar13->typeId = (Id)local_248;
    pIVar13->opCode = OpAtomicIAdd;
    pVVar2 = &pIVar13->operands;
    (pIVar13->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pIVar13->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined1 (*) [16])
     &(pIVar13->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = pIVar12->resultId;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,
               (iterator)0x0,(uint *)&local_268);
    IVar5 = spv::Builder::makeIntegerType(pBVar18,0x20,false);
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ =
         spv::Builder::makeIntConstant(pBVar18,IVar5,1,false);
    iVar17._M_current =
         (pIVar13->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar17._M_current ==
        (pIVar13->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,iVar17,
                 (uint *)&local_268);
    }
    else {
      *iVar17._M_current =
           (Capability)
           local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (pIVar13->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar17._M_current + 1;
    }
    pFVar8 = local_230;
    IVar5 = spv::Builder::makeIntegerType(pBVar18,0x20,false);
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ =
         spv::Builder::makeIntConstant(pBVar18,IVar5,0,false);
    iVar17._M_current =
         (pIVar13->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar14 = (pIVar13->operands).
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (iVar17._M_current == puVar14) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,iVar17,
                 (uint *)&local_268);
      iVar17._M_current =
           (pIVar13->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      puVar14 = (pIVar13->operands).
                super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar17._M_current =
           (Capability)
           local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start;
      iVar17._M_current = iVar17._M_current + 1;
      (pIVar13->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar17._M_current;
    }
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = pIVar9->resultId;
    local_1f0 = pIVar13;
    local_180 = pIVar12;
    if (iVar17._M_current == puVar14) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,iVar17,
                 (uint *)&local_268);
    }
    else {
      *iVar17._M_current =
           (Capability)
           local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (pIVar13->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar17._M_current + 1;
    }
    CVar7 = (pFVar8->parameterInstructions).
            super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start[1]->resultId;
    IVar6 = (local_238->builder).uniqueId + 1;
    (local_238->builder).uniqueId = IVar6;
    IVar5 = spv::Builder::makePointer(pBVar18,StorageClassPhysicalStorageBuffer,(Id)local_248);
    pIVar9 = (Instruction *)allocate_in_thread(0x38);
    pIVar9->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
    pIVar9->resultId = IVar6;
    pIVar9->typeId = IVar5;
    pIVar9->opCode = OpInBoundsAccessChain;
    pVVar2 = &pIVar9->operands;
    (pIVar9->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pIVar9->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined1 (*) [16])
     &(pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = local_220->resultId;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,
               (iterator)0x0,(uint *)&local_268);
    IVar5 = spv::Builder::makeIntegerType(pBVar18,0x20,false);
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ =
         spv::Builder::makeIntConstant(pBVar18,IVar5,2,false);
    iVar17._M_current =
         (pIVar9->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar14 = (pIVar9->operands).
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (iVar17._M_current == puVar14) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,iVar17,
                 (uint *)&local_268);
      iVar17._M_current =
           (pIVar9->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      puVar14 = (pIVar9->operands).
                super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar17._M_current =
           (Capability)
           local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start;
      iVar17._M_current = iVar17._M_current + 1;
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar17._M_current;
    }
    if (iVar17._M_current == puVar14) {
      local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = CVar7;
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,iVar17,
                 (uint *)&local_268);
    }
    else {
      *iVar17._M_current = CVar7;
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar17._M_current + 1;
      local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = CVar7;
    }
    IVar5 = (local_238->builder).uniqueId + 1;
    (local_238->builder).uniqueId = IVar5;
    pIVar12 = (Instruction *)allocate_in_thread(0x38);
    pIVar12->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
    pIVar12->resultId = IVar5;
    pIVar12->typeId = (Id)local_248;
    pIVar12->opCode = OpAtomicIAdd;
    pVVar2 = &pIVar12->operands;
    (pIVar12->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pIVar12->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined1 (*) [16])
     &(pIVar12->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = pIVar9->resultId;
    local_190 = pIVar9;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,
               (iterator)0x0,(uint *)&local_268);
    IVar5 = spv::Builder::makeIntegerType(pBVar18,0x20,false);
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ =
         spv::Builder::makeIntConstant(pBVar18,IVar5,1,false);
    iVar17._M_current =
         (pIVar12->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar17._M_current ==
        (pIVar12->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,iVar17,
                 (uint *)&local_268);
    }
    else {
      *iVar17._M_current =
           (Capability)
           local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (pIVar12->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar17._M_current + 1;
    }
    IVar5 = spv::Builder::makeIntegerType(pBVar18,0x20,false);
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ =
         spv::Builder::makeIntConstant(pBVar18,IVar5,0,false);
    iVar17._M_current =
         (pIVar12->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar14 = (pIVar12->operands).
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (iVar17._M_current == puVar14) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,iVar17,
                 (uint *)&local_268);
      iVar17._M_current =
           (pIVar12->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      puVar14 = (pIVar12->operands).
                super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar17._M_current =
           (Capability)
           local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start;
      iVar17._M_current = iVar17._M_current + 1;
      (pIVar12->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar17._M_current;
    }
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = (Capability)local_210;
    local_188 = pIVar12;
    if (iVar17._M_current == puVar14) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,iVar17,
                 (uint *)&local_268);
    }
    else {
      *iVar17._M_current = (Capability)local_210;
      (pIVar12->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar17._M_current + 1;
    }
    IVar5 = (local_238->builder).uniqueId + 1;
    (local_238->builder).uniqueId = IVar5;
    pIVar9 = (Instruction *)allocate_in_thread(0x38);
    pIVar9->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
    pIVar9->resultId = IVar5;
    pIVar9->typeId = (Id)local_248;
    pIVar9->opCode = OpShiftLeftLogical;
    (pIVar9->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pIVar9->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined1 (*) [16])
     &(pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = CVar7;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar9->operands,(iterator)0x0,(uint *)&local_268);
    IVar5 = spv::Builder::makeIntegerType(pBVar18,0x20,false);
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ =
         spv::Builder::makeIntConstant(pBVar18,IVar5,8,false);
    iVar17._M_current =
         (pIVar9->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar17._M_current ==
        (pIVar9->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar9->operands,iVar17,(uint *)&local_268);
    }
    else {
      *iVar17._M_current =
           (Capability)
           local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar17._M_current + 1;
    }
    IVar5 = (local_238->builder).uniqueId + 1;
    (local_238->builder).uniqueId = IVar5;
    pIVar12 = (Instruction *)allocate_in_thread(0x38);
    pIVar12->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
    pIVar12->resultId = IVar5;
    pIVar12->typeId = (Id)local_248;
    pIVar12->opCode = OpISub;
    (pIVar12->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pIVar12->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined1 (*) [16])
     &(pIVar12->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = (Capability)local_210;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar12->operands,(iterator)0x0,(uint *)&local_268);
    IVar5 = spv::Builder::makeIntegerType(pBVar18,0x20,false);
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ =
         spv::Builder::makeIntConstant(pBVar18,IVar5,1,false);
    iVar17._M_current =
         (pIVar12->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_1d8 = pIVar9;
    if (iVar17._M_current ==
        (pIVar12->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar12->operands,iVar17,(uint *)&local_268);
    }
    else {
      *iVar17._M_current =
           (Capability)
           local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (pIVar12->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar17._M_current + 1;
    }
    IVar5 = (local_238->builder).uniqueId + 1;
    (local_238->builder).uniqueId = IVar5;
    pIVar9 = (Instruction *)allocate_in_thread(0x38);
    pIVar9->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
    pIVar9->resultId = IVar5;
    pIVar9->typeId = (Id)local_248;
    pIVar9->opCode = OpBitwiseOr;
    (pIVar9->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pIVar9->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined1 (*) [16])
     &(pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = local_1d8->resultId;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar9->operands,(iterator)0x0,(uint *)&local_268);
    iVar17._M_current =
         (pIVar9->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = pIVar12->resultId;
    local_210 = pIVar9;
    if (iVar17._M_current ==
        (pIVar9->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar9->operands,iVar17,(uint *)&local_268);
    }
    else {
      *iVar17._M_current =
           (Capability)
           local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar17._M_current + 1;
    }
    IVar5 = (local_238->builder).uniqueId + 1;
    (local_238->builder).uniqueId = IVar5;
    pIVar9 = (Instruction *)allocate_in_thread(0x38);
    pIVar9->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
    pIVar9->resultId = IVar5;
    pIVar9->typeId = (Id)local_248;
    pIVar9->opCode = OpAtomicIIncrement;
    pVVar2 = &pIVar9->operands;
    (pIVar9->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pIVar9->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined1 (*) [16])
     &(pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = local_1d0->resultId;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,
               (iterator)0x0,(uint *)&local_268);
    IVar5 = spv::Builder::makeIntegerType(pBVar18,0x20,false);
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ =
         spv::Builder::makeIntConstant(pBVar18,IVar5,1,false);
    iVar17._M_current =
         (pIVar9->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar17._M_current ==
        (pIVar9->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,iVar17,
                 (uint *)&local_268);
    }
    else {
      *iVar17._M_current =
           (Capability)
           local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar17._M_current + 1;
    }
    IVar5 = spv::Builder::makeIntegerType(pBVar18,0x20,false);
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ =
         spv::Builder::makeIntConstant(pBVar18,IVar5,0,false);
    iVar17._M_current =
         (pIVar9->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar17._M_current ==
        (pIVar9->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,iVar17,
                 (uint *)&local_268);
    }
    else {
      *iVar17._M_current =
           (Capability)
           local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar17._M_current + 1;
    }
    IVar5 = (local_238->builder).uniqueId + 1;
    (local_238->builder).uniqueId = IVar5;
    pIVar13 = (Instruction *)allocate_in_thread(0x38);
    pIVar13->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
    pIVar13->resultId = IVar5;
    pIVar13->typeId = (Id)local_248;
    pIVar13->opCode = OpIMul;
    (pIVar13->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pIVar13->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined1 (*) [16])
     &(pIVar13->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
    IVar5 = spv::Builder::makeIntegerType(pBVar18,0x20,false);
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ =
         spv::Builder::makeIntConstant(pBVar18,IVar5,2,false);
    iVar17._M_current =
         (pIVar13->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar14 = (pIVar13->operands).
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (iVar17._M_current == puVar14) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar13->operands,iVar17,(uint *)&local_268);
      iVar17._M_current =
           (pIVar13->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      puVar14 = (pIVar13->operands).
                super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar17._M_current =
           (Capability)
           local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start;
      iVar17._M_current = iVar17._M_current + 1;
      (pIVar13->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar17._M_current;
    }
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = pIVar9->resultId;
    local_1a0 = pIVar9;
    local_198 = pIVar12;
    if (iVar17._M_current == puVar14) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar13->operands,iVar17,(uint *)&local_268);
    }
    else {
      *iVar17._M_current =
           (Capability)
           local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (pIVar13->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar17._M_current + 1;
    }
    IVar5 = (local_238->builder).uniqueId + 1;
    (local_238->builder).uniqueId = IVar5;
    pIVar9 = (Instruction *)allocate_in_thread(0x38);
    pIVar9->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
    pIVar9->resultId = IVar5;
    pIVar9->typeId = (Id)local_248;
    pIVar9->opCode = OpIAdd;
    (pIVar9->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pIVar9->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined1 (*) [16])
     &(pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ =
         (local_230->parameterInstructions).
         super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
         ._M_impl.super__Vector_impl_data._M_start[4]->resultId;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar9->operands,(iterator)0x0,(uint *)&local_268);
    iVar17._M_current =
         (pIVar9->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = pIVar13->resultId;
    local_1a8 = pIVar13;
    if (iVar17._M_current ==
        (pIVar9->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar9->operands,iVar17,(uint *)&local_268);
    }
    else {
      *iVar17._M_current =
           (Capability)
           local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar17._M_current + 1;
    }
    IVar5 = (local_238->builder).uniqueId + 1;
    (local_238->builder).uniqueId = IVar5;
    pIVar12 = (Instruction *)allocate_in_thread(0x38);
    pIVar12->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
    pIVar12->resultId = IVar5;
    pIVar12->typeId = (Id)local_248;
    pIVar12->opCode = OpIAdd;
    (pIVar12->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pIVar12->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined1 (*) [16])
     &(pIVar12->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = pIVar9->resultId;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar12->operands,(iterator)0x0,(uint *)&local_268);
    IVar5 = spv::Builder::makeIntegerType(pBVar18,0x20,false);
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ =
         spv::Builder::makeIntConstant(pBVar18,IVar5,1,false);
    iVar17._M_current =
         (pIVar12->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_1e0 = pIVar9;
    if (iVar17._M_current ==
        (pIVar12->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar12->operands,iVar17,(uint *)&local_268);
    }
    else {
      *iVar17._M_current =
           (Capability)
           local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (pIVar12->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar17._M_current + 1;
    }
    IVar6 = (local_238->builder).uniqueId + 1;
    (local_238->builder).uniqueId = IVar6;
    IVar5 = spv::Builder::makePointer(pBVar18,StorageClassPhysicalStorageBuffer,(Id)local_248);
    pIVar9 = (Instruction *)allocate_in_thread(0x38);
    pIVar9->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
    pIVar9->resultId = IVar6;
    pIVar9->typeId = IVar5;
    pIVar9->opCode = OpInBoundsAccessChain;
    pVVar2 = &pIVar9->operands;
    (pIVar9->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pIVar9->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined1 (*) [16])
     &(pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = local_220->resultId;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,
               (iterator)0x0,(uint *)&local_268);
    IVar5 = spv::Builder::makeIntegerType(pBVar18,0x20,false);
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ =
         spv::Builder::makeIntConstant(pBVar18,IVar5,2,false);
    iVar17._M_current =
         (pIVar9->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar14 = (pIVar9->operands).
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (iVar17._M_current == puVar14) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,iVar17,
                 (uint *)&local_268);
      iVar17._M_current =
           (pIVar9->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      puVar14 = (pIVar9->operands).
                super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar17._M_current =
           (Capability)
           local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start;
      iVar17._M_current = iVar17._M_current + 1;
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar17._M_current;
    }
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = local_1e0->resultId;
    local_1e8 = pIVar12;
    if (iVar17._M_current == puVar14) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,iVar17,
                 (uint *)&local_268);
    }
    else {
      *iVar17._M_current =
           (Capability)
           local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar17._M_current + 1;
    }
    pIVar12 = (Instruction *)allocate_in_thread(0x38);
    pIVar12->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
    pIVar12->resultId = 0;
    pIVar12->typeId = 0;
    pIVar12->opCode = OpStore;
    pVVar2 = &pIVar12->operands;
    (pIVar12->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pIVar12->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined1 (*) [16])
     &(pIVar12->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = pIVar9->resultId;
    local_1b0 = pIVar9;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,
               (iterator)0x0,(uint *)&local_268);
    iVar17._M_current =
         (pIVar12->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar14 = (pIVar12->operands).
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = local_210->resultId;
    if (iVar17._M_current == puVar14) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,iVar17,
                 (uint *)&local_268);
      iVar17._M_current =
           (pIVar12->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      puVar14 = (pIVar12->operands).
                super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar17._M_current =
           (Capability)
           local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start;
      iVar17._M_current = iVar17._M_current + 1;
      (pIVar12->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar17._M_current;
    }
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = CapabilityGeometry;
    if (iVar17._M_current == puVar14) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,iVar17,
                 (uint *)&local_268);
      iVar17._M_current =
           (pIVar12->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      puVar14 = (pIVar12->operands).
                super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar17._M_current = 2;
      iVar17._M_current = iVar17._M_current + 1;
      (pIVar12->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar17._M_current;
    }
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = CapabilityFloat16Buffer;
    if (iVar17._M_current == puVar14) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,iVar17,
                 (uint *)&local_268);
    }
    else {
      *iVar17._M_current = 8;
      (pIVar12->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar17._M_current + 1;
    }
    IVar6 = (local_238->builder).uniqueId + 1;
    (local_238->builder).uniqueId = IVar6;
    IVar5 = spv::Builder::makePointer(pBVar18,StorageClassPhysicalStorageBuffer,(Id)local_248);
    pIVar9 = (Instruction *)allocate_in_thread(0x38);
    pIVar9->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
    pIVar9->resultId = IVar6;
    pIVar9->typeId = IVar5;
    pIVar9->opCode = OpInBoundsAccessChain;
    pVVar2 = &pIVar9->operands;
    (pIVar9->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pIVar9->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined1 (*) [16])
     &(pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = local_220->resultId;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,
               (iterator)0x0,(uint *)&local_268);
    IVar5 = spv::Builder::makeIntegerType(pBVar18,0x20,false);
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ =
         spv::Builder::makeIntConstant(pBVar18,IVar5,2,false);
    iVar17._M_current =
         (pIVar9->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar14 = (pIVar9->operands).
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (iVar17._M_current == puVar14) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,iVar17,
                 (uint *)&local_268);
      iVar17._M_current =
           (pIVar9->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      puVar14 = (pIVar9->operands).
                super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar17._M_current =
           (Capability)
           local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start;
      iVar17._M_current = iVar17._M_current + 1;
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar17._M_current;
    }
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = local_1e8->resultId;
    if (iVar17._M_current == puVar14) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,iVar17,
                 (uint *)&local_268);
    }
    else {
      *iVar17._M_current =
           (Capability)
           local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar17._M_current + 1;
    }
    pIVar13 = (Instruction *)allocate_in_thread(0x38);
    pIVar13->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
    pIVar13->resultId = 0;
    pIVar13->typeId = 0;
    pIVar13->opCode = OpStore;
    pVVar2 = &pIVar13->operands;
    (pIVar13->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pIVar13->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined1 (*) [16])
     &(pIVar13->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = pIVar9->resultId;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,
               (iterator)0x0,(uint *)&local_268);
    iVar17._M_current =
         (pIVar13->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar14 = (pIVar13->operands).
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = local_1f0->resultId;
    if (iVar17._M_current == puVar14) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,iVar17,
                 (uint *)&local_268);
      iVar17._M_current =
           (pIVar13->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      puVar14 = (pIVar13->operands).
                super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar17._M_current =
           (Capability)
           local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start;
      iVar17._M_current = iVar17._M_current + 1;
      (pIVar13->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar17._M_current;
    }
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = CapabilityGeometry;
    if (iVar17._M_current == puVar14) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,iVar17,
                 (uint *)&local_268);
      iVar17._M_current =
           (pIVar13->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      puVar14 = (pIVar13->operands).
                super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar17._M_current = 2;
      iVar17._M_current = iVar17._M_current + 1;
      (pIVar13->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar17._M_current;
    }
    local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 4;
    if (iVar17._M_current == puVar14) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,iVar17,
                 (uint *)&local_268);
    }
    else {
      *iVar17._M_current = 4;
      (pIVar13->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar17._M_current + 1;
    }
    pIVar15 = local_1d8;
    local_1fc = local_1f0->resultId;
    local_c0._M_head_impl = local_170;
    add_instruction(local_238,local_240,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_c0);
    if (local_c0._M_head_impl != (Instruction *)0x0) {
      (*(local_c0._M_head_impl)->_vptr_Instruction[1])();
    }
    pIVar4 = local_238;
    local_c0._M_head_impl = (Instruction *)0x0;
    local_c8._M_head_impl = local_178;
    add_instruction(local_238,local_240,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_c8);
    if (local_c8._M_head_impl != (Instruction *)0x0) {
      (*(local_c8._M_head_impl)->_vptr_Instruction[1])();
    }
    local_c8._M_head_impl = (Instruction *)0x0;
    local_d0._M_head_impl = local_1c8;
    add_instruction(pIVar4,local_240,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_d0);
    if (local_d0._M_head_impl != (Instruction *)0x0) {
      (*(local_d0._M_head_impl)->_vptr_Instruction[1])();
    }
    local_d0._M_head_impl = (Instruction *)0x0;
    local_d8._M_head_impl = local_220;
    add_instruction(pIVar4,local_240,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_d8);
    if (local_d8._M_head_impl != (Instruction *)0x0) {
      (*(local_d8._M_head_impl)->_vptr_Instruction[1])();
    }
    local_d8._M_head_impl = (Instruction *)0x0;
    local_e0._M_head_impl = local_180;
    add_instruction(pIVar4,local_240,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_e0);
    if (local_e0._M_head_impl != (Instruction *)0x0) {
      (*(local_e0._M_head_impl)->_vptr_Instruction[1])();
    }
    local_e0._M_head_impl = (Instruction *)0x0;
    local_e8._M_head_impl = local_1d0;
    add_instruction(pIVar4,local_240,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_e8);
    if (local_e8._M_head_impl != (Instruction *)0x0) {
      (*(local_e8._M_head_impl)->_vptr_Instruction[1])();
    }
    local_e8._M_head_impl = (Instruction *)0x0;
    local_f0._M_head_impl = local_1f0;
    add_instruction(pIVar4,local_240,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_f0);
    if (local_f0._M_head_impl != (Instruction *)0x0) {
      (*(local_f0._M_head_impl)->_vptr_Instruction[1])();
    }
    local_f0._M_head_impl = (Instruction *)0x0;
    local_f8._M_head_impl = local_190;
    add_instruction(pIVar4,local_240,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_f8);
    if (local_f8._M_head_impl != (Instruction *)0x0) {
      (*(local_f8._M_head_impl)->_vptr_Instruction[1])();
    }
    local_f8._M_head_impl = (Instruction *)0x0;
    local_100._M_head_impl = pIVar15;
    add_instruction(pIVar4,local_240,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_100);
    if (local_100._M_head_impl != (Instruction *)0x0) {
      (*(local_100._M_head_impl)->_vptr_Instruction[1])();
    }
    local_100._M_head_impl = (Instruction *)0x0;
    local_108._M_head_impl = local_198;
    add_instruction(pIVar4,local_240,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_108);
    if (local_108._M_head_impl != (Instruction *)0x0) {
      (*(local_108._M_head_impl)->_vptr_Instruction[1])();
    }
    local_108._M_head_impl = (Instruction *)0x0;
    local_110._M_head_impl = local_210;
    add_instruction(pIVar4,local_240,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_110);
    if (local_110._M_head_impl != (Instruction *)0x0) {
      (*(local_110._M_head_impl)->_vptr_Instruction[1])();
    }
    local_110._M_head_impl = (Instruction *)0x0;
    local_118._M_head_impl = local_1a0;
    add_instruction(pIVar4,local_240,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_118);
    if (local_118._M_head_impl != (Instruction *)0x0) {
      (*(local_118._M_head_impl)->_vptr_Instruction[1])();
    }
    local_118._M_head_impl = (Instruction *)0x0;
    local_120._M_head_impl = local_1a8;
    add_instruction(pIVar4,local_240,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_120);
    if (local_120._M_head_impl != (Instruction *)0x0) {
      (*(local_120._M_head_impl)->_vptr_Instruction[1])();
    }
    local_120._M_head_impl = (Instruction *)0x0;
    local_128._M_head_impl = local_188;
    add_instruction(pIVar4,local_240,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_128);
    if (local_128._M_head_impl != (Instruction *)0x0) {
      (*(local_128._M_head_impl)->_vptr_Instruction[1])();
    }
    local_128._M_head_impl = (Instruction *)0x0;
    local_130._M_head_impl = local_1e0;
    add_instruction(pIVar4,local_240,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_130);
    if (local_130._M_head_impl != (Instruction *)0x0) {
      (*(local_130._M_head_impl)->_vptr_Instruction[1])();
    }
    local_130._M_head_impl = (Instruction *)0x0;
    local_138._M_head_impl = local_1e8;
    add_instruction(pIVar4,local_240,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_138);
    if (local_138._M_head_impl != (Instruction *)0x0) {
      (*(local_138._M_head_impl)->_vptr_Instruction[1])();
    }
    local_138._M_head_impl = (Instruction *)0x0;
    local_140._M_head_impl = local_1b0;
    add_instruction(pIVar4,local_240,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_140);
    if (local_140._M_head_impl != (Instruction *)0x0) {
      (*(local_140._M_head_impl)->_vptr_Instruction[1])();
    }
    local_140._M_head_impl = (Instruction *)0x0;
    local_148._M_head_impl = pIVar12;
    add_instruction(pIVar4,local_240,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_148);
    if (local_148._M_head_impl != (Instruction *)0x0) {
      (*(local_148._M_head_impl)->_vptr_Instruction[1])();
    }
    local_148._M_head_impl = (Instruction *)0x0;
    local_150._M_head_impl = pIVar9;
    add_instruction(pIVar4,local_240,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_150);
    if (local_150._M_head_impl != (Instruction *)0x0) {
      (*(local_150._M_head_impl)->_vptr_Instruction[1])();
    }
    local_150._M_head_impl = (Instruction *)0x0;
    local_158._M_head_impl = pIVar13;
    add_instruction(pIVar4,local_240,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_158);
    if (local_158._M_head_impl != (Instruction *)0x0) {
      (*(local_158._M_head_impl)->_vptr_Instruction[1])();
    }
    pBVar18 = local_218;
    pBVar10 = local_228;
    local_220 = (Instruction *)(local_168 * 4 + 0xdcc);
    local_158._M_head_impl = (Instruction *)0x0;
    if ((char)local_204 == '\0') {
      pIVar9 = (Instruction *)allocate_in_thread(0x38);
      pIVar9->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
      pIVar9->resultId = 0;
      pIVar9->typeId = 0;
      pIVar9->opCode = OpStore;
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      *(undefined1 (*) [16])
       &(pIVar9->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
      local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = local_208;
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar9->operands,(iterator)0x0,(uint *)&local_268);
      iVar17._M_current =
           (pIVar9->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = local_1fc;
      if (iVar17._M_current ==
          (pIVar9->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                   &pIVar9->operands,iVar17,(uint *)&local_268);
      }
      else {
        *iVar17._M_current = local_1fc;
        (pIVar9->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar17._M_current + 1;
      }
      pBVar18 = local_218;
      local_50._M_head_impl = pIVar9;
      add_instruction(pIVar4,local_240,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_50);
      if (local_50._M_head_impl != (Instruction *)0x0) {
        (*(local_50._M_head_impl)->_vptr_Instruction[1])();
      }
      pBVar10 = local_228;
      spv::Builder::createBranch(pBVar18,local_228);
      (pIVar4->builder).buildPoint = pBVar10;
      pIVar9 = (Instruction *)allocate_in_thread(0x38);
      pIVar9->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
      pIVar9->resultId = 0;
      pIVar9->typeId = 0;
      pIVar9->opCode = OpControlBarrier;
      pVVar2 = &pIVar9->operands;
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      *(undefined1 (*) [16])
       &(pIVar9->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
      IVar5 = spv::Builder::makeIntegerType(pBVar18,0x20,false);
      CVar7 = spv::Builder::makeIntConstant(pBVar18,IVar5,2,false);
      iVar17._M_current =
           (pIVar9->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = CVar7;
      if (iVar17._M_current ==
          (pIVar9->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,
                   iVar17,(uint *)&local_268);
      }
      else {
        *iVar17._M_current = CVar7;
        (pIVar9->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar17._M_current + 1;
      }
      IVar5 = spv::Builder::makeIntegerType(pBVar18,0x20,false);
      local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ =
           spv::Builder::makeIntConstant(pBVar18,IVar5,2,false);
      iVar17._M_current =
           (pIVar9->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar17._M_current ==
          (pIVar9->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,
                   iVar17,(uint *)&local_268);
      }
      else {
        *iVar17._M_current =
             (Capability)
             local_268.
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
        (pIVar9->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar17._M_current + 1;
      }
      IVar5 = spv::Builder::makeIntegerType(pBVar18,0x20,false);
      local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ =
           spv::Builder::makeIntConstant(pBVar18,IVar5,0x108,false);
      iVar17._M_current =
           (pIVar9->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar17._M_current ==
          (pIVar9->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,
                   iVar17,(uint *)&local_268);
      }
      else {
        *iVar17._M_current =
             (Capability)
             local_268.
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
        (pIVar9->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar17._M_current + 1;
      }
      local_58._M_head_impl = pIVar9;
      add_instruction(pIVar4,local_228,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_58);
      if (local_58._M_head_impl != (Instruction *)0x0) {
        (*(local_58._M_head_impl)->_vptr_Instruction[1])();
      }
      IVar5 = (pIVar4->builder).uniqueId + 1;
      (pIVar4->builder).uniqueId = IVar5;
      pIVar9 = (Instruction *)allocate_in_thread(0x38);
      pIVar9->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
      pIVar9->resultId = IVar5;
      pIVar9->typeId = (Id)local_248;
      pIVar9->opCode = OpLoad;
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      *(undefined1 (*) [16])
       &(pIVar9->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
      local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = local_208;
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar9->operands,(iterator)0x0,(uint *)&local_268);
      local_248 = (vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                  CONCAT44(local_248._4_4_,pIVar9->resultId);
      local_88._M_head_impl = pIVar9;
      add_instruction(pIVar4,local_228,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_88);
      if (local_88._M_head_impl != (Instruction *)0x0) {
        (*(local_88._M_head_impl)->_vptr_Instruction[1])();
      }
      pIVar9 = (Instruction *)allocate_in_thread(0x38);
      pIVar9->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
      pIVar9->resultId = 0;
      pIVar9->typeId = 0;
      pIVar9->opCode = OpControlBarrier;
      pVVar2 = &pIVar9->operands;
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      *(undefined1 (*) [16])
       &(pIVar9->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
      IVar5 = spv::Builder::makeIntegerType(pBVar18,0x20,false);
      CVar7 = spv::Builder::makeIntConstant(pBVar18,IVar5,2,false);
      pFVar8 = local_230;
      iVar17._M_current =
           (pIVar9->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = CVar7;
      if (iVar17._M_current ==
          (pIVar9->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,
                   iVar17,(uint *)&local_268);
      }
      else {
        *iVar17._M_current = CVar7;
        (pIVar9->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar17._M_current + 1;
      }
      IVar5 = spv::Builder::makeIntegerType(pBVar18,0x20,false);
      local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ =
           spv::Builder::makeIntConstant(pBVar18,IVar5,2,false);
      iVar17._M_current =
           (pIVar9->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar17._M_current ==
          (pIVar9->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,
                   iVar17,(uint *)&local_268);
      }
      else {
        *iVar17._M_current =
             (Capability)
             local_268.
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
        (pIVar9->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar17._M_current + 1;
      }
      IVar5 = spv::Builder::makeIntegerType(pBVar18,0x20,false);
      local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ =
           spv::Builder::makeIntConstant(pBVar18,IVar5,0x108,false);
      iVar17._M_current =
           (pIVar9->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar17._M_current ==
          (pIVar9->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,
                   iVar17,(uint *)&local_268);
      }
      else {
        *iVar17._M_current =
             (Capability)
             local_268.
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
        (pIVar9->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar17._M_current + 1;
      }
      local_90._M_head_impl = pIVar9;
      add_instruction(pIVar4,local_228,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_90);
      _Var3._M_head_impl = local_90._M_head_impl;
    }
    else {
      spv::Builder::createBranch(local_218,local_228);
      (pIVar4->builder).buildPoint = pBVar10;
      IVar5 = (pIVar4->builder).uniqueId + 1;
      (pIVar4->builder).uniqueId = IVar5;
      pBVar10 = (Block *)allocate_in_thread(0x38);
      pBVar10->_vptr_Block = (_func_int **)&PTR__Instruction_001f31e0;
      *(Id *)&(pBVar10->instructions).
              super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = IVar5;
      *(Id *)((long)&(pBVar10->instructions).
                     super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 4) = (Id)local_248;
      *(undefined4 *)
       &(pBVar10->instructions).
        super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = 0x15d;
      this_01 = &(pBVar10->instructions).
                 super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      *(undefined1 (*) [16])
       &(pBVar10->instructions).
        super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
      (pBVar10->predecessors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pBVar10->predecessors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      IVar5 = spv::Builder::makeIntegerType(pBVar18,0x20,false);
      CVar7 = spv::Builder::makeIntConstant(pBVar18,IVar5,3,false);
      iVar17._M_current =
           (uint *)(pBVar10->predecessors).
                   super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
      ppBVar16 = (pBVar10->predecessors).
                 super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      if ((pointer)iVar17._M_current == ppBVar16) {
        local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start._0_4_ = CVar7;
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)this_01,
                   iVar17,(uint *)&local_268);
        iVar17._M_current =
             (uint *)(pBVar10->predecessors).
                     super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        ppBVar16 = (pBVar10->predecessors).
                   super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        *iVar17._M_current = CVar7;
        iVar17._M_current = iVar17._M_current + 1;
        (pBVar10->predecessors).
        super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)iVar17._M_current;
      }
      pFVar8 = local_230;
      local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = CapabilityGeometry;
      if ((pointer)iVar17._M_current == ppBVar16) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)this_01,
                   iVar17,(uint *)&local_268);
        iVar17._M_current =
             (uint *)(pBVar10->predecessors).
                     super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        ppBVar16 = (pBVar10->predecessors).
                   super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        *iVar17._M_current = 2;
        iVar17._M_current = iVar17._M_current + 1;
        (pBVar10->predecessors).
        super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)iVar17._M_current;
      }
      local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ =
           (pFVar8->parameterInstructions).
           super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
           ._M_impl.super__Vector_impl_data._M_start[2]->resultId;
      local_240 = pBVar10;
      if ((pointer)iVar17._M_current == ppBVar16) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)this_01,
                   iVar17,(uint *)&local_268);
      }
      else {
        *iVar17._M_current =
             (Capability)
             local_268.
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
        (pBVar10->predecessors).
        super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)(iVar17._M_current + 1);
      }
      IVar5 = (pIVar4->builder).uniqueId + 1;
      (pIVar4->builder).uniqueId = IVar5;
      pIVar9 = (Instruction *)allocate_in_thread(0x38);
      pIVar9->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
      pIVar9->resultId = IVar5;
      pIVar9->typeId = (Id)local_248;
      pIVar9->opCode = OpPhi;
      pVVar2 = &pIVar9->operands;
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      *(undefined1 (*) [16])
       &(pIVar9->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
      local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = local_1fc;
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,
                 (iterator)0x0,(uint *)&local_268);
      iVar17._M_current =
           (pIVar9->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      puVar14 = (pIVar9->operands).
                super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ =
           *(Capability *)
            ((long)(((local_1c0->
                     super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start)->_M_t).
                   super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_> +
            8);
      if (iVar17._M_current == puVar14) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,
                   iVar17,(uint *)&local_268);
        iVar17._M_current =
             (pIVar9->operands).
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_finish;
        puVar14 = (pIVar9->operands).
                  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
      }
      else {
        *iVar17._M_current =
             (Capability)
             local_268.
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
        iVar17._M_current = iVar17._M_current + 1;
        (pIVar9->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar17._M_current;
      }
      local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = local_200;
      if (iVar17._M_current == puVar14) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,
                   iVar17,(uint *)&local_268);
        iVar17._M_current =
             (pIVar9->operands).
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_finish;
        puVar14 = (pIVar9->operands).
                  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
      }
      else {
        *iVar17._M_current = local_200;
        iVar17._M_current = iVar17._M_current + 1;
        (pIVar9->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar17._M_current;
      }
      local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ =
           *(Capability *)
            ((long)(((local_1b8->
                     super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start)->_M_t).
                   super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_> +
            8);
      if (iVar17._M_current == puVar14) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)pVVar2,
                   iVar17,(uint *)&local_268);
      }
      else {
        *iVar17._M_current =
             (Capability)
             local_268.
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
        (pIVar9->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar17._M_current + 1;
      }
      IVar5 = (pIVar4->builder).uniqueId + 1;
      (pIVar4->builder).uniqueId = IVar5;
      pIVar12 = (Instruction *)allocate_in_thread(0x38);
      pBVar18 = local_218;
      pIVar12->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
      pIVar12->resultId = IVar5;
      pIVar12->typeId = (Id)local_248;
      pIVar12->opCode = OpGroupNonUniformBroadcastFirst;
      (pIVar12->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pIVar12->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      *(undefined1 (*) [16])
       &(pIVar12->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
      IVar5 = spv::Builder::makeIntegerType(local_218,0x20,false);
      local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ =
           spv::Builder::makeIntConstant(pBVar18,IVar5,3,false);
      iVar17._M_current =
           (pIVar12->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      puVar14 = (pIVar12->operands).
                super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
      if (iVar17._M_current == puVar14) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                   &pIVar12->operands,iVar17,(uint *)&local_268);
        iVar17._M_current =
             (pIVar12->operands).
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_finish;
        puVar14 = (pIVar12->operands).
                  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
      }
      else {
        *iVar17._M_current =
             (Capability)
             local_268.
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
        iVar17._M_current = iVar17._M_current + 1;
        (pIVar12->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar17._M_current;
      }
      local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = pIVar9->resultId;
      if (iVar17._M_current == puVar14) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                   &pIVar12->operands,iVar17,(uint *)&local_268);
      }
      else {
        *iVar17._M_current =
             (Capability)
             local_268.
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
        (pIVar12->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar17._M_current + 1;
      }
      IVar5 = (pIVar4->builder).uniqueId + 1;
      (pIVar4->builder).uniqueId = IVar5;
      pIVar13 = (Instruction *)allocate_in_thread(0x38);
      pIVar13->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
      pIVar13->resultId = IVar5;
      pIVar13->typeId = (Id)local_248;
      pIVar13->opCode = OpIMul;
      (pIVar13->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pIVar13->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      *(undefined1 (*) [16])
       &(pIVar13->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
      local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ =
           *(Capability *)
            &(local_240->instructions).
             super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar13->operands,(iterator)0x0,(uint *)&local_268);
      iVar17._M_current =
           (pIVar13->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ =
           (local_230->parameterInstructions).
           super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
           ._M_impl.super__Vector_impl_data._M_start[3]->resultId;
      if (iVar17._M_current ==
          (pIVar13->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                   &pIVar13->operands,iVar17,(uint *)&local_268);
      }
      else {
        *iVar17._M_current =
             (Capability)
             local_268.
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
        (pIVar13->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar17._M_current + 1;
      }
      IVar5 = (pIVar4->builder).uniqueId + 1;
      (pIVar4->builder).uniqueId = IVar5;
      pIVar15 = (Instruction *)allocate_in_thread(0x38);
      pIVar15->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
      pIVar15->resultId = IVar5;
      pIVar15->typeId = (Id)local_248;
      pIVar15->opCode = OpIAdd;
      local_248 = (vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                  &pIVar15->operands;
      (pIVar15->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pIVar15->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      *(undefined1 (*) [16])
       &(pIVar15->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
      local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = pIVar12->resultId;
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>(local_248,(iterator)0x0,(uint *)&local_268);
      iVar17._M_current =
           (pIVar15->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_268.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = pIVar13->resultId;
      if (iVar17._M_current ==
          (pIVar15->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(local_248,iVar17,(uint *)&local_268);
      }
      else {
        *iVar17._M_current = pIVar13->resultId;
        (pIVar15->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar17._M_current + 1;
      }
      local_248 = (vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                  CONCAT44(local_248._4_4_,pIVar15->resultId);
      local_60._M_head_impl = pIVar9;
      add_instruction(pIVar4,local_228,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_60);
      if (local_60._M_head_impl != (Instruction *)0x0) {
        (*(local_60._M_head_impl)->_vptr_Instruction[1])();
      }
      local_68._M_head_impl = pIVar12;
      add_instruction(pIVar4,local_228,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_68);
      local_70._M_head_impl = (Instruction *)local_240;
      if (local_68._M_head_impl != (Instruction *)0x0) {
        (*(local_68._M_head_impl)->_vptr_Instruction[1])();
      }
      add_instruction(pIVar4,local_228,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_70);
      pBVar18 = local_218;
      if ((Block *)local_70._M_head_impl != (Block *)0x0) {
        (*(local_70._M_head_impl)->_vptr_Instruction[1])();
      }
      local_78._M_head_impl = pIVar13;
      add_instruction(pIVar4,local_228,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_78);
      if (local_78._M_head_impl != (Instruction *)0x0) {
        (*(local_78._M_head_impl)->_vptr_Instruction[1])();
      }
      local_80._M_head_impl = pIVar15;
      add_instruction(pIVar4,local_228,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_80);
      pFVar8 = local_230;
      _Var3._M_head_impl = local_80._M_head_impl;
    }
    if (_Var3._M_head_impl != (Instruction *)0x0) {
      (*(_Var3._M_head_impl)->_vptr_Instruction[1])();
    }
    spv::Builder::makeReturn(pBVar18,false,(Id)local_248);
    (pIVar4->builder).buildPoint = local_160;
    IVar5 = (pFVar8->functionInstruction).resultId;
    *(Id *)((long)&(pIVar4->super_BlockEmissionInterface)._vptr_BlockEmissionInterface +
           (long)local_220) = IVar5;
    return IVar5;
  }
  return (&this->allocate_thread_node_records_call_id)[local_168];
}

Assistant:

spv::Id SPIRVModule::Impl::build_allocate_node_records(SPIRVModule &, bool per_thread)
{
	auto &call_id = per_thread ? allocate_thread_node_records_call_id : allocate_group_node_records_call_id;
	if (call_id)
		return call_id;

	auto *current_build_point = builder.getBuildPoint();
	spv::Block *entry = nullptr;
	spv::Id bool_type = builder.makeBoolType();
	spv::Id uint_type = builder.makeUintType(32);
	spv::Id uint64_type = builder.makeUintType(64);
	auto *func = builder.makeFunctionEntry(spv::NoPrecision, uint_type,
	                                       per_thread ? "AllocateThreadNodeRecords" : "AllocateGroupNodeRecords",
	                                       { uint64_type, uint_type, uint_type, uint_type, uint_type },
	                                       {}, &entry);

	builder.addName(func->getParamId(0), "AtomicCountersBDA");
	builder.addName(func->getParamId(1), "NodeMetadataIndex");
	builder.addName(func->getParamId(2), "Count");
	builder.addName(func->getParamId(3), "Stride");
	builder.addName(func->getParamId(4), "AllocationOffset");

	spv::Id total_count_id;
	spv::Id phi_undefined_id = 0;

	if (per_thread)
	{
		// Do this on a per-wave basis. The node metadata index can be divergent, and we need to consider
		// that the outer function is a waterfall loop.
		builder.addCapability(spv::CapabilityGroupNonUniformBallot);
		builder.addCapability(spv::CapabilityGroupNonUniformArithmetic);

		auto counts_total =
		    std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpGroupNonUniformIAdd);
		counts_total->addIdOperand(builder.makeUintConstant(spv::ScopeSubgroup));
		counts_total->addImmediateOperand(spv::GroupOperationReduce);
		counts_total->addIdOperand(func->getParamId(2));

		total_count_id = counts_total->getResultId();
		add_instruction(entry, std::move(counts_total));

		phi_undefined_id = builder.createUndefined(uint_type);
	}
	else
	{
		total_count_id = func->getParamId(2);
	}

	auto *return_block = new spv::Block(builder.getUniqueId(), *func);
	auto check_empty = std::make_unique<spv::Instruction>(builder.getUniqueId(), bool_type, spv::OpIEqual);
	check_empty->addIdOperand(total_count_id);
	check_empty->addIdOperand(builder.makeUintConstant(0));
	spv::Id return_early_cond_id = check_empty->getResultId();
	add_instruction(entry, std::move(check_empty));

	auto *reconverge_block = new spv::Block(builder.getUniqueId(), *func);
	builder.setBuildPoint(entry);
	builder.createSelectionMerge(reconverge_block, 0);
	builder.createConditionalBranch(return_early_cond_id, return_block, reconverge_block);
	builder.setBuildPoint(return_block);
	builder.makeReturn(false, builder.makeUintConstant(0));

	auto *body_block = new spv::Block(builder.getUniqueId(), *func);
	auto *merge_block = new spv::Block(builder.getUniqueId(), *func);

	spv::Id shared_id = 0;
	if (!per_thread)
		shared_id = create_variable(spv::StorageClassWorkgroup, uint_type, "AllocateGroupNodeRecordsShared");

	spv::Id is_first_lane_id;

	if (per_thread)
	{
		auto is_first_lane = std::make_unique<spv::Instruction>(builder.getUniqueId(), bool_type, spv::OpGroupNonUniformElect);
		is_first_lane->addIdOperand(builder.makeUintConstant(spv::ScopeSubgroup));
		is_first_lane_id = is_first_lane->getResultId();
		add_instruction(reconverge_block, std::move(is_first_lane));
	}
	else
	{
		spv::Id local_invocation_index = get_builtin_shader_input(spv::BuiltInLocalInvocationIndex);
		auto load_local_index = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpLoad);
		load_local_index->addIdOperand(local_invocation_index);

		auto is_first_lane = std::make_unique<spv::Instruction>(builder.getUniqueId(), bool_type, spv::OpIEqual);
		is_first_lane->addIdOperand(load_local_index->getResultId());
		is_first_lane->addIdOperand(builder.makeUintConstant(0));
		is_first_lane_id = is_first_lane->getResultId();
		add_instruction(reconverge_block, std::move(load_local_index));
		add_instruction(reconverge_block, std::move(is_first_lane));
	}

	builder.setBuildPoint(reconverge_block);
	builder.createSelectionMerge(merge_block, 0);
	builder.createConditionalBranch(is_first_lane_id, body_block, merge_block);

	spv::Id payload_offset_id;
	builder.setBuildPoint(body_block);
	{
		// Compute required payload bytes to allocate, and align.
		auto mul_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpIMul);
		mul_op->addIdOperand(total_count_id);
		mul_op->addIdOperand(func->getParamId(3));

		auto add_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpIAdd);
		add_op->addIdOperand(mul_op->getResultId());
		add_op->addIdOperand(builder.makeUintConstant(15));

		auto and_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpBitwiseAnd);
		and_op->addIdOperand(add_op->getResultId());
		and_op->addIdOperand(builder.makeUintConstant(~15u));

		spv::Id uint_array_type = builder.makeRuntimeArray(uint_type);
		builder.addDecoration(uint_array_type, spv::DecorationArrayStride, 4);
		spv::Id struct_type_id = builder.makeStructType({ uint_type, uint_type, uint_array_type }, "NodeAtomics");
		builder.addDecoration(struct_type_id, spv::DecorationBlock);
		builder.addMemberName(struct_type_id, 0, "payloadCount");
		builder.addMemberName(struct_type_id, 1, "fusedCount");
		builder.addMemberName(struct_type_id, 2, "perNodeTotal");
		builder.addMemberDecoration(struct_type_id, 0, spv::DecorationOffset, 0);
		builder.addMemberDecoration(struct_type_id, 1, spv::DecorationOffset, 4);
		builder.addMemberDecoration(struct_type_id, 2, spv::DecorationOffset, 8);

		auto cast_op = std::make_unique<spv::Instruction>(
		    builder.getUniqueId(),
		    builder.makePointer(spv::StorageClassPhysicalStorageBuffer, struct_type_id),
		    spv::OpBitcast);
		cast_op->addIdOperand(func->getParamId(0));

		auto chain_payload_total_op = std::make_unique<spv::Instruction>(
		    builder.getUniqueId(),
		    builder.makePointer(spv::StorageClassPhysicalStorageBuffer, uint_type),
		    spv::OpInBoundsAccessChain);
		chain_payload_total_op->addIdOperand(cast_op->getResultId());
		chain_payload_total_op->addIdOperand(builder.makeUintConstant(0));

		auto chain_fused_total_op = std::make_unique<spv::Instruction>(
		    builder.getUniqueId(),
		    builder.makePointer(spv::StorageClassPhysicalStorageBuffer, uint_type),
		    spv::OpInBoundsAccessChain);
		chain_fused_total_op->addIdOperand(cast_op->getResultId());
		chain_fused_total_op->addIdOperand(builder.makeUintConstant(1));

		auto payload_total_atomic_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpAtomicIAdd);
		payload_total_atomic_op->addIdOperand(chain_payload_total_op->getResultId());
		payload_total_atomic_op->addIdOperand(builder.makeUintConstant(spv::ScopeDevice));
		payload_total_atomic_op->addIdOperand(builder.makeUintConstant(0)); // There is no implied sync.
		payload_total_atomic_op->addIdOperand(and_op->getResultId());

		spv::Id node_index = func->getParamId(1);

		auto chain_node_total_op = std::make_unique<spv::Instruction>(
		    builder.getUniqueId(),
		    builder.makePointer(spv::StorageClassPhysicalStorageBuffer, uint_type),
		    spv::OpInBoundsAccessChain);
		chain_node_total_op->addIdOperand(cast_op->getResultId());
		chain_node_total_op->addIdOperand(builder.makeUintConstant(2));
		chain_node_total_op->addIdOperand(node_index);

		auto atomic_total_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpAtomicIAdd);
		atomic_total_op->addIdOperand(chain_node_total_op->getResultId());
		atomic_total_op->addIdOperand(builder.makeUintConstant(spv::ScopeDevice));
		atomic_total_op->addIdOperand(builder.makeUintConstant(0)); // There is no implied sync.
		atomic_total_op->addIdOperand(total_count_id);

		auto shift_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpShiftLeftLogical);
		shift_op->addIdOperand(node_index);
		shift_op->addIdOperand(builder.makeUintConstant(8));

		auto count_minus_1 = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpISub);
		count_minus_1->addIdOperand(total_count_id);
		count_minus_1->addIdOperand(builder.makeUintConstant(1));

		auto or_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpBitwiseOr);
		or_op->addIdOperand(shift_op->getResultId());
		or_op->addIdOperand(count_minus_1->getResultId());

		auto fused_atomic_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpAtomicIIncrement);
		fused_atomic_op->addIdOperand(chain_fused_total_op->getResultId());
		fused_atomic_op->addIdOperand(builder.makeUintConstant(spv::ScopeDevice));
		fused_atomic_op->addIdOperand(builder.makeUintConstant(0)); // There is no implied sync.

		auto fused_mul2 = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpIMul);
		fused_mul2->addIdOperand(builder.makeUintConstant(2));
		fused_mul2->addIdOperand(fused_atomic_op->getResultId());

		auto payload_add_atomic_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpIAdd);
		payload_add_atomic_op->addIdOperand(func->getParamId(4));
		payload_add_atomic_op->addIdOperand(fused_mul2->getResultId());

		auto payload_add_atomic_op_plus_1 = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpIAdd);
		payload_add_atomic_op_plus_1->addIdOperand(payload_add_atomic_op->getResultId());
		payload_add_atomic_op_plus_1->addIdOperand(builder.makeUintConstant(1));

		auto chain_payload_op = std::make_unique<spv::Instruction>(
		    builder.getUniqueId(),
		    builder.makePointer(spv::StorageClassPhysicalStorageBuffer, uint_type),
		    spv::OpInBoundsAccessChain);
		chain_payload_op->addIdOperand(cast_op->getResultId());
		chain_payload_op->addIdOperand(builder.makeUintConstant(2));
		chain_payload_op->addIdOperand(payload_add_atomic_op->getResultId());

		auto store_payload_inst = std::make_unique<spv::Instruction>(spv::OpStore);
		store_payload_inst->addIdOperand(chain_payload_op->getResultId());
		store_payload_inst->addIdOperand(or_op->getResultId());
		store_payload_inst->addImmediateOperand(spv::MemoryAccessAlignedMask);
		store_payload_inst->addImmediateOperand(8);

		auto chain_payload_op_plus_1 = std::make_unique<spv::Instruction>(
		    builder.getUniqueId(),
		    builder.makePointer(spv::StorageClassPhysicalStorageBuffer, uint_type),
		    spv::OpInBoundsAccessChain);
		chain_payload_op_plus_1->addIdOperand(cast_op->getResultId());
		chain_payload_op_plus_1->addIdOperand(builder.makeUintConstant(2));
		chain_payload_op_plus_1->addIdOperand(payload_add_atomic_op_plus_1->getResultId());

		auto store_payload_inst_plus_1 = std::make_unique<spv::Instruction>(spv::OpStore);
		store_payload_inst_plus_1->addIdOperand(chain_payload_op_plus_1->getResultId());
		store_payload_inst_plus_1->addIdOperand(payload_total_atomic_op->getResultId());
		store_payload_inst_plus_1->addImmediateOperand(spv::MemoryAccessAlignedMask);
		store_payload_inst_plus_1->addImmediateOperand(4);

		payload_offset_id = payload_total_atomic_op->getResultId();

		add_instruction(body_block, std::move(mul_op));
		add_instruction(body_block, std::move(add_op));
		add_instruction(body_block, std::move(and_op));
		add_instruction(body_block, std::move(cast_op));
		add_instruction(body_block, std::move(chain_payload_total_op));
		add_instruction(body_block, std::move(chain_fused_total_op));
		add_instruction(body_block, std::move(payload_total_atomic_op));
		add_instruction(body_block, std::move(chain_node_total_op));
		add_instruction(body_block, std::move(shift_op));
		add_instruction(body_block, std::move(count_minus_1));
		add_instruction(body_block, std::move(or_op));
		add_instruction(body_block, std::move(fused_atomic_op));
		add_instruction(body_block, std::move(fused_mul2));
		add_instruction(body_block, std::move(atomic_total_op));
		add_instruction(body_block, std::move(payload_add_atomic_op));
		add_instruction(body_block, std::move(payload_add_atomic_op_plus_1));
		add_instruction(body_block, std::move(chain_payload_op));
		add_instruction(body_block, std::move(store_payload_inst));
		add_instruction(body_block, std::move(chain_payload_op_plus_1));
		add_instruction(body_block, std::move(store_payload_inst_plus_1));

		if (!per_thread)
		{
			auto store_inst = std::make_unique<spv::Instruction>(spv::OpStore);
			store_inst->addIdOperand(shared_id);
			store_inst->addIdOperand(payload_offset_id);
			add_instruction(body_block, std::move(store_inst));
		}

		builder.createBranch(merge_block);
	}
	builder.setBuildPoint(merge_block);

	if (!per_thread)
	{
		auto barrier_op = std::make_unique<spv::Instruction>(spv::OpControlBarrier);
		barrier_op->addIdOperand(builder.makeUintConstant(spv::ScopeWorkgroup));
		barrier_op->addIdOperand(builder.makeUintConstant(spv::ScopeWorkgroup));
		barrier_op->addIdOperand(
		    builder.makeUintConstant(spv::MemorySemanticsAcquireReleaseMask | spv::MemorySemanticsWorkgroupMemoryMask));
		add_instruction(merge_block, std::move(barrier_op));
	}

	spv::Id return_value;

	if (per_thread)
	{
		auto counts_offsets =
		    std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpGroupNonUniformIAdd);
		counts_offsets->addIdOperand(builder.makeUintConstant(spv::ScopeSubgroup));
		counts_offsets->addImmediateOperand(spv::GroupOperationExclusiveScan);
		counts_offsets->addIdOperand(func->getParamId(2));

		auto phi_node = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpPhi);
		phi_node->addIdOperand(payload_offset_id);
		phi_node->addIdOperand(body_block->getId());
		phi_node->addIdOperand(phi_undefined_id);
		phi_node->addIdOperand(reconverge_block->getId());

		auto broadcast_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpGroupNonUniformBroadcastFirst);
		broadcast_op->addIdOperand(builder.makeUintConstant(spv::ScopeSubgroup));
		broadcast_op->addIdOperand(phi_node->getResultId());

		auto mul_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpIMul);
		mul_op->addIdOperand(counts_offsets->getResultId());
		mul_op->addIdOperand(func->getParamId(3));

		auto add_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpIAdd);
		add_op->addIdOperand(broadcast_op->getResultId());
		add_op->addIdOperand(mul_op->getResultId());

		return_value = add_op->getResultId();

		add_instruction(merge_block, std::move(phi_node));
		add_instruction(merge_block, std::move(broadcast_op));
		add_instruction(merge_block, std::move(counts_offsets));
		add_instruction(merge_block, std::move(mul_op));
		add_instruction(merge_block, std::move(add_op));
	}
	else
	{
		auto load_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpLoad);
		load_op->addIdOperand(shared_id);
		return_value = load_op->getResultId();
		add_instruction(merge_block, std::move(load_op));
	}

	if (!per_thread)
	{
		// Avoid WAR hazard for back-to-back allocations.
		auto barrier_op = std::make_unique<spv::Instruction>(spv::OpControlBarrier);
		barrier_op->addIdOperand(builder.makeUintConstant(spv::ScopeWorkgroup));
		barrier_op->addIdOperand(builder.makeUintConstant(spv::ScopeWorkgroup));
		barrier_op->addIdOperand(
		    builder.makeUintConstant(spv::MemorySemanticsAcquireReleaseMask | spv::MemorySemanticsWorkgroupMemoryMask));
		add_instruction(merge_block, std::move(barrier_op));
	}

	builder.makeReturn(false, return_value);
	builder.setBuildPoint(current_build_point);
	call_id = func->getId();
	return func->getId();
}